

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O1

void pub_read_record(ECF_Data *newdata,char *buf)

{
  uint uVar1;
  
  uVar1 = PacketProcessor::Number(*buf,0xfe,0xfe,0xfe);
  newdata->base = (uchar)uVar1;
  uVar1 = PacketProcessor::Number(buf[1],0xfe,0xfe,0xfe);
  newdata->type = (uchar)uVar1;
  uVar1 = PacketProcessor::Number(buf[2],buf[3],0xfe,0xfe);
  newdata->str = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[4],buf[5],0xfe,0xfe);
  newdata->intl = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[6],buf[7],0xfe,0xfe);
  newdata->wis = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[8],buf[9],0xfe,0xfe);
  newdata->agi = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[10],buf[0xb],0xfe,0xfe);
  newdata->con = (short)uVar1;
  uVar1 = PacketProcessor::Number(buf[0xc],buf[0xd],0xfe,0xfe);
  newdata->cha = (short)uVar1;
  return;
}

Assistant:

void pub_read_record(ECF_Data& newdata, char* buf)
{
	newdata.base = PacketProcessor::Number(buf[0]);
	newdata.type = PacketProcessor::Number(buf[1]);

	newdata.str = PacketProcessor::Number(buf[2], buf[3]);
	newdata.intl = PacketProcessor::Number(buf[4], buf[5]);
	newdata.wis = PacketProcessor::Number(buf[6], buf[7]);
	newdata.agi = PacketProcessor::Number(buf[8], buf[9]);
	newdata.con = PacketProcessor::Number(buf[10], buf[11]);
	newdata.cha = PacketProcessor::Number(buf[12], buf[13]);
}